

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

int pgrsupdate(Curl_easy *data,_Bool showprogress)

{
  int iVar1;
  int result_1;
  int result;
  _Bool showprogress_local;
  Curl_easy *data_local;
  
  if (((data->progress).flags & 0x10U) == 0) {
    if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
      if ((data->set).fprogress != (curl_progress_callback)0x0) {
        Curl_set_in_callback(data,true);
        iVar1 = (*(data->set).fprogress)
                          ((data->set).progress_client,(double)(data->progress).dl.total_size,
                           (double)(data->progress).dl.cur_size,
                           (double)(data->progress).ul.total_size,
                           (double)(data->progress).ul.cur_size);
        Curl_set_in_callback(data,false);
        if (iVar1 != 0x10000001) {
          if (iVar1 == 0) {
            return 0;
          }
          Curl_failf(data,"Callback aborted");
          return iVar1;
        }
      }
    }
    else {
      Curl_set_in_callback(data,true);
      iVar1 = (*(data->set).fxferinfo)
                        ((data->set).progress_client,(data->progress).dl.total_size,
                         (data->progress).dl.cur_size,(data->progress).ul.total_size,
                         (data->progress).ul.cur_size);
      Curl_set_in_callback(data,false);
      if (iVar1 != 0x10000001) {
        if (iVar1 == 0) {
          return 0;
        }
        Curl_failf(data,"Callback aborted");
        return iVar1;
      }
    }
    if (showprogress) {
      progress_meter(data);
    }
  }
  return 0;
}

Assistant:

static int pgrsupdate(struct Curl_easy *data, bool showprogress)
{
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There is a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.dl.total_size,
                                   data->progress.dl.cur_size,
                                   data->progress.ul.total_size,
                                   data->progress.ul.cur_size);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }
    else if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.dl.total_size,
                                   (double)data->progress.dl.cur_size,
                                   (double)data->progress.ul.total_size,
                                   (double)data->progress.ul.cur_size);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }

    if(showprogress)
      progress_meter(data);
  }

  return 0;
}